

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>::vector<float_const*>
          (vector<float,pstd::pmr::polymorphic_allocator<float>> *this,float *first,float *last,
          polymorphic_allocator<float> *alloc)

{
  float fVar1;
  float *pfVar2;
  
  *(memory_resource **)this = alloc->memoryResource;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_>::reserve
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)this,
             (long)last - (long)first >> 2);
  if (last != first) {
    pfVar2 = *(float **)(this + 8);
    do {
      fVar1 = *first;
      first = first + 1;
      *pfVar2 = fVar1;
      pfVar2 = pfVar2 + 1;
    } while (first != last);
  }
  *(undefined8 *)(this + 0x18) = *(undefined8 *)(this + 0x10);
  return;
}

Assistant:

vector(InputIt first, InputIt last, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(last - first);
        size_t i = 0;
        for (InputIt iter = first; iter != last; ++iter, ++i)
            this->alloc.template construct<T>(ptr + i, *iter);
        nStored = nAlloc;
    }